

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  long lVar1;
  u16 uVar2;
  u32 uVar3;
  uint uVar4;
  uint uVar5;
  sqlite3_io_methods *psVar6;
  u32 *puVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  void *pvVar12;
  u32 *aContent;
  sqlite3 *psVar13;
  int iVar14;
  int iVar15;
  uint *__s;
  ht_slot *aTmp;
  uint uVar16;
  ulong uVar17;
  short sVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  u64 n;
  ushort *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  uint *puVar31;
  undefined1 auVar32 [16];
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar58 [16];
  int isChanged;
  i64 nSize;
  i64 nReq;
  ulong local_198;
  uint local_18c;
  ht_slot *local_188;
  int local_17c;
  ulong local_178;
  ulong local_170;
  void *local_168;
  long local_160;
  uint local_154;
  WalHashLoc local_150;
  ulong local_138;
  uint *local_130;
  ulong local_128;
  long local_120;
  long local_118;
  sqlite3 *local_110;
  long local_108;
  uint local_100 [52];
  long lVar35;
  
  local_17c = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  local_168 = pBusyArg;
  local_110 = db;
  iVar29 = eMode;
  if ((pWal->exclusiveMode == '\0') &&
     (iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10), iVar14 != 0))
  goto LAB_00130e65;
  pvVar12 = local_168;
  pWal->ckptLock = '\x01';
  if (eMode != 0) {
    do {
      if (pWal->exclusiveMode != '\0') {
LAB_00130aad:
        pWal->writeLock = '\x01';
        goto LAB_00130abd;
      }
      iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
      if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar14 != 5)) {
        if (iVar14 != 5) {
          if (iVar14 == 0) goto LAB_00130aad;
          goto LAB_00130aea;
        }
        break;
      }
      iVar14 = (*xBusy)(pvVar12);
    } while (iVar14 != 0);
    xBusy = (_func_int_void_ptr *)0x0;
  }
  iVar29 = 0;
LAB_00130abd:
  iVar14 = walIndexReadHdr(pWal,&local_17c);
  if (local_17c != 0) {
    psVar6 = pWal->pDbFd->pMethods;
    if (2 < psVar6->iVersion) {
      (*psVar6->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
    }
  }
LAB_00130aea:
  if (iVar14 != 0) goto LAB_00130e65;
  uVar19 = (pWal->hdr).mxFrame;
  uVar2 = (pWal->hdr).szPage;
  uVar16 = CONCAT22(uVar2,uVar2) & 0x1fe00;
  if ((uVar19 != 0) && (uVar16 != nBuf)) {
    iVar14 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10024,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    goto LAB_00130e65;
  }
  puVar7 = *pWal->apWiData;
  if (puVar7[0x18] < uVar19) {
    local_128 = (ulong)(pWal->hdr).nPage;
    iVar14 = 0;
    lVar28 = 1;
    do {
      uVar21 = puVar7[lVar28 + 0x19];
      if (uVar21 < uVar19) {
        iVar20 = (int)lVar28 + 3;
        do {
          if (pWal->exclusiveMode != '\0') {
LAB_00130be1:
            uVar21 = 0xffffffff;
            if (lVar28 == 1) {
              uVar21 = uVar19;
            }
            puVar7[lVar28 + 0x19] = uVar21;
            iVar14 = 0;
            if (pWal->exclusiveMode == '\0') {
              (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar20,1,9);
            }
            goto LAB_00130c33;
          }
          iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar20,1,10);
          if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar14 != 5)) {
            if (iVar14 == 5) goto LAB_00130c07;
            if (iVar14 == 0) goto LAB_00130be1;
            __s = (uint *)0x0;
            goto LAB_00130e28;
          }
          iVar14 = (*xBusy)(local_168);
        } while (iVar14 != 0);
        iVar14 = 5;
LAB_00130c07:
        xBusy = (_func_int_void_ptr *)0x0;
        uVar19 = uVar21;
      }
LAB_00130c33:
      lVar28 = lVar28 + 1;
    } while (lVar28 != 5);
    if (uVar19 <= puVar7[0x18]) {
      __s = (uint *)0x0;
      goto LAB_00130c9f;
    }
    uVar3 = puVar7[0x18];
    uVar21 = (pWal->hdr).mxFrame;
    iVar14 = sqlite3_initialize();
    if (iVar14 == 0) {
      uVar30 = (ulong)(uVar21 + 0x1000) + 0xffffffff021 >> 0xc;
      local_160 = uVar30 << 0x20;
      n = (local_160 >> 0x1b) + (ulong)uVar21 * 2 + 0x28;
      __s = (uint *)sqlite3Malloc(n);
      if (__s != (uint *)0x0) {
        iVar20 = (int)uVar30;
        local_138 = (ulong)uVar21;
        memset(__s,0,n);
        __s[1] = iVar20 + 1;
        iVar15 = sqlite3_initialize();
        iVar14 = 7;
        if (iVar15 != 0) {
LAB_00130dba:
          sqlite3_free(__s);
          __s = (uint *)0x0;
          goto LAB_00130c9f;
        }
        uVar21 = 0x1000;
        if ((uint)local_138 < 0x1000) {
          uVar21 = (uint)local_138;
        }
        aTmp = (ht_slot *)sqlite3Malloc((ulong)(uVar21 * 2));
        if ((aTmp == (ht_slot *)0x0) ||
           (iVar15 = (int)((ulong)(uVar3 + 0x1001) + 0xffffffff021 >> 0xc), iVar20 < iVar15)) {
          sqlite3_free(aTmp);
          if (aTmp == (ht_slot *)0x0) goto LAB_00130dba;
        }
        else {
          local_130 = __s + 2;
          lVar28 = (long)iVar15;
          local_160 = local_160 >> 0x20;
          local_120 = (long)__s + 0x16;
          do {
            iVar14 = walHashGet(pWal,(int)lVar28,&local_150);
            aContent = local_150.aPgno;
            auVar11 = _DAT_001a4820;
            if (iVar14 != 0) {
              sqlite3_free(aTmp);
              goto LAB_00130dba;
            }
            if (lVar28 == local_160) {
              local_178 = (ulong)((int)local_138 - local_150.iZero);
            }
            else {
              local_178 = (ulong)((long)local_150.aHash - (long)local_150.aPgno) >> 2;
            }
            lVar1 = (long)local_130 + (ulong)local_150.iZero * 2 + (long)(int)__s[1] * 0x20;
            local_154 = local_150.iZero + 1;
            local_118 = lVar28;
            if ((int)local_178 < 1) {
              local_18c = 0;
              local_188 = (ht_slot *)0x0;
              local_150.iZero = local_154;
              memset(&local_108,0,0xd0);
              uVar21 = 1;
LAB_0013137a:
              uVar22 = (ulong)uVar21;
              puVar31 = local_100 + uVar22 * 4;
              uVar30 = local_178;
              do {
                if (((uint)uVar30 >> ((uint)uVar22 & 0x1f) & 1) != 0) {
                  walMerge(aContent,*(ht_slot **)puVar31,puVar31[-2],&local_188,(int *)&local_18c,
                           aTmp);
                  uVar30 = local_178;
                }
                uVar22 = uVar22 + 1;
                puVar31 = puVar31 + 4;
              } while ((int)uVar22 != 0xd);
            }
            else {
              local_170 = local_178 & 0xffffffff;
              lVar28 = local_170 - 1;
              auVar32._8_4_ = (int)lVar28;
              auVar32._0_8_ = lVar28;
              auVar32._12_4_ = (int)((ulong)lVar28 >> 0x20);
              lVar28 = (long)(int)__s[1] * 0x20 + (ulong)local_150.iZero * 2 + local_120;
              auVar32 = auVar32 ^ _DAT_001a4820;
              uVar30 = 0;
              auVar34 = _DAT_001a4810;
              auVar36 = _DAT_001a4800;
              auVar37 = _DAT_001a4840;
              auVar38 = _DAT_001a4830;
              do {
                auVar39 = auVar34 ^ auVar11;
                iVar14 = auVar32._0_4_;
                iVar52 = -(uint)(iVar14 < auVar39._0_4_);
                iVar20 = auVar32._4_4_;
                auVar40._4_4_ = -(uint)(iVar20 < auVar39._4_4_);
                iVar15 = auVar32._8_4_;
                iVar55 = -(uint)(iVar15 < auVar39._8_4_);
                iVar33 = auVar32._12_4_;
                auVar40._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                auVar49._4_4_ = iVar52;
                auVar49._0_4_ = iVar52;
                auVar49._8_4_ = iVar55;
                auVar49._12_4_ = iVar55;
                auVar56 = pshuflw(in_XMM8,auVar49,0xe8);
                auVar42._4_4_ = -(uint)(auVar39._4_4_ == iVar20);
                auVar42._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar58 = pshuflw(in_XMM9,auVar42,0xe8);
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar57 = pshuflw(auVar56,auVar40,0xe8);
                auVar39._8_4_ = 0xffffffff;
                auVar39._0_8_ = 0xffffffffffffffff;
                auVar39._12_4_ = 0xffffffff;
                auVar39 = (auVar57 | auVar58 & auVar56) ^ auVar39;
                auVar39 = packssdw(auVar39,auVar39);
                sVar18 = (short)uVar30;
                if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -0xe + uVar30 * 2) = sVar18;
                }
                auVar40 = auVar42 & auVar49 | auVar40;
                auVar39 = packssdw(auVar40,auVar40);
                auVar57._8_4_ = 0xffffffff;
                auVar57._0_8_ = 0xffffffffffffffff;
                auVar57._12_4_ = 0xffffffff;
                auVar39 = packssdw(auVar39 ^ auVar57,auVar39 ^ auVar57);
                if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
                  *(short *)(lVar28 + -0xc + uVar30 * 2) = sVar18 + 1;
                }
                auVar39 = auVar36 ^ auVar11;
                iVar52 = -(uint)(iVar14 < auVar39._0_4_);
                auVar53._4_4_ = -(uint)(iVar20 < auVar39._4_4_);
                iVar55 = -(uint)(iVar15 < auVar39._8_4_);
                auVar53._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                auVar41._4_4_ = iVar52;
                auVar41._0_4_ = iVar52;
                auVar41._8_4_ = iVar55;
                auVar41._12_4_ = iVar55;
                auVar48._4_4_ = -(uint)(auVar39._4_4_ == iVar20);
                auVar48._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar53._0_4_ = auVar53._4_4_;
                auVar53._8_4_ = auVar53._12_4_;
                auVar39 = auVar48 & auVar41 | auVar53;
                auVar39 = packssdw(auVar39,auVar39);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar39 = packssdw(auVar39 ^ auVar9,auVar39 ^ auVar9);
                if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -10 + uVar30 * 2) = sVar18 + 2;
                }
                auVar42 = pshufhw(auVar41,auVar41,0x84);
                auVar49 = pshufhw(auVar48,auVar48,0x84);
                auVar40 = pshufhw(auVar42,auVar53,0x84);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar43 = (auVar40 | auVar49 & auVar42) ^ auVar43;
                auVar42 = packssdw(auVar43,auVar43);
                if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -8 + uVar30 * 2) = sVar18 + 3;
                }
                auVar42 = auVar37 ^ auVar11;
                iVar52 = -(uint)(iVar14 < auVar42._0_4_);
                auVar45._4_4_ = -(uint)(iVar20 < auVar42._4_4_);
                iVar55 = -(uint)(iVar15 < auVar42._8_4_);
                auVar45._12_4_ = -(uint)(iVar33 < auVar42._12_4_);
                auVar50._4_4_ = iVar52;
                auVar50._0_4_ = iVar52;
                auVar50._8_4_ = iVar55;
                auVar50._12_4_ = iVar55;
                auVar39 = pshuflw(auVar39,auVar50,0xe8);
                auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar20);
                auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar33);
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                in_XMM9 = pshuflw(auVar58 & auVar56,auVar44,0xe8);
                in_XMM9 = in_XMM9 & auVar39;
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar39 = pshuflw(auVar39,auVar45,0xe8);
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar56 = (auVar39 | in_XMM9) ^ auVar56;
                auVar39 = packssdw(auVar56,auVar56);
                if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -6 + uVar30 * 2) = sVar18 + 4;
                }
                auVar45 = auVar44 & auVar50 | auVar45;
                auVar39 = packssdw(auVar45,auVar45);
                auVar58._8_4_ = 0xffffffff;
                auVar58._0_8_ = 0xffffffffffffffff;
                auVar58._12_4_ = 0xffffffff;
                auVar39 = packssdw(auVar39 ^ auVar58,auVar39 ^ auVar58);
                if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -4 + uVar30 * 2) = sVar18 + 5;
                }
                auVar39 = auVar38 ^ auVar11;
                iVar14 = -(uint)(iVar14 < auVar39._0_4_);
                auVar54._4_4_ = -(uint)(iVar20 < auVar39._4_4_);
                iVar15 = -(uint)(iVar15 < auVar39._8_4_);
                auVar54._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                auVar46._4_4_ = iVar14;
                auVar46._0_4_ = iVar14;
                auVar46._8_4_ = iVar15;
                auVar46._12_4_ = iVar15;
                auVar51._4_4_ = -(uint)(auVar39._4_4_ == iVar20);
                auVar51._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                auVar51._0_4_ = auVar51._4_4_;
                auVar51._8_4_ = auVar51._12_4_;
                auVar54._0_4_ = auVar54._4_4_;
                auVar54._8_4_ = auVar54._12_4_;
                auVar39 = auVar51 & auVar46 | auVar54;
                auVar39 = packssdw(auVar39,auVar39);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar39 ^ auVar10,auVar39 ^ auVar10);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + -2 + uVar30 * 2) = sVar18 + 6;
                }
                auVar39 = pshufhw(auVar46,auVar46,0x84);
                auVar40 = pshufhw(auVar51,auVar51,0x84);
                auVar42 = pshufhw(auVar39,auVar54,0x84);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar47 = (auVar42 | auVar40 & auVar39) ^ auVar47;
                auVar39 = packssdw(auVar47,auVar47);
                if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(short *)(lVar28 + uVar30 * 2) = sVar18 + 7;
                }
                uVar30 = uVar30 + 8;
                lVar35 = auVar34._8_8_;
                auVar34._0_8_ = auVar34._0_8_ + 8;
                auVar34._8_8_ = lVar35 + 8;
                lVar35 = auVar36._8_8_;
                auVar36._0_8_ = auVar36._0_8_ + 8;
                auVar36._8_8_ = lVar35 + 8;
                lVar35 = auVar37._8_8_;
                auVar37._0_8_ = auVar37._0_8_ + 8;
                auVar37._8_8_ = lVar35 + 8;
                lVar35 = auVar38._8_8_;
                auVar38._0_8_ = auVar38._0_8_ + 8;
                auVar38._8_8_ = lVar35 + 8;
              } while (((int)local_178 + 7U & 0xfffffff8) != uVar30);
              local_150.iZero = local_154;
              memset(&local_108,0,0xd0);
              uVar30 = 0;
              do {
                local_18c = 1;
                local_188 = (ht_slot *)(lVar1 + uVar30 * 2);
                uVar22 = 0;
                if ((uVar30 & 1) != 0) {
                  do {
                    walMerge(aContent,*(ht_slot **)(local_100 + uVar22 * 4),
                             local_100[(uVar22 * 2 + -1) * 2],&local_188,(int *)&local_18c,aTmp);
                    uVar21 = (int)uVar22 + 1;
                    uVar22 = (ulong)uVar21;
                  } while (((uint)uVar30 >> (uVar21 & 0x1f) & 1) != 0);
                }
                *(ht_slot **)(local_100 + uVar22 * 4) = local_188;
                local_100[(uVar22 * 2 + -1) * 2] = local_18c;
                uVar30 = uVar30 + 1;
              } while (uVar30 != local_170);
              uVar21 = (int)uVar22 + 1;
              if (uVar21 < 0xd) goto LAB_0013137a;
            }
            local_130[local_118 * 8 + 7] = local_154;
            local_130[local_118 * 8 + 6] = local_18c;
            *(long *)(local_130 + local_118 * 8 + 2) = lVar1;
            *(u32 **)(local_130 + local_118 * 8 + 4) = aContent;
            lVar28 = local_118 + 1;
          } while (local_118 < local_160);
          sqlite3_free(aTmp);
        }
        do {
          if (pWal->exclusiveMode != '\0') {
LAB_001314b5:
            local_170 = CONCAT44(local_170._4_4_,puVar7[0x18]);
            puVar7[0x20] = uVar19;
            uVar21 = (uint)sync_flags >> 2 & 3;
            if ((uVar21 != 0) &&
               (iVar14 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar21), iVar14 != 0))
            goto LAB_0013172b;
            uVar30 = (ulong)uVar16;
            local_108 = local_128 * uVar30;
            (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,0x27,(void *)0x0);
            iVar14 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,(sqlite3_int64 *)&local_150);
            if (iVar14 != 0) goto LAB_0013172b;
            if ((long)local_150.aHash < local_108) {
              if ((long)((long)local_150.aHash + (pWal->hdr).mxFrame * uVar30 + 0x10000) < local_108
                 ) {
                iVar14 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf917,
                            "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
                goto LAB_0013172b;
              }
              psVar6 = pWal->pDbFd->pMethods;
              if (psVar6 != (sqlite3_io_methods *)0x0) {
                (*psVar6->xFileControl)(pWal->pDbFd,5,&local_108);
              }
            }
            psVar13 = local_110;
            uVar24 = __s[1];
            if ((int)uVar24 < 1) goto LAB_00131711;
            local_178 = (ulong)(uVar16 | 0x18);
            uVar25 = 0;
            uVar26 = (uint)local_170;
            goto LAB_001315e8;
          }
          iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
          if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar14 != 5)) {
            if (iVar14 == 0) goto LAB_001314b5;
            goto LAB_00130c9f;
          }
          iVar14 = (*xBusy)(local_168);
          iVar20 = 0;
        } while (iVar14 != 0);
        goto LAB_00130ca7;
      }
    }
    sqlite3_free((void *)0x0);
    iVar14 = 7;
    goto LAB_00130e65;
  }
  __s = (uint *)0x0;
  iVar20 = 0;
LAB_00130ca7:
  iVar14 = iVar20;
  if ((iVar29 == 0) || (iVar14 != 0)) {
LAB_00130e28:
    sqlite3_free(__s);
    if ((iVar14 != 5) && (iVar14 != 0)) goto LAB_00130e65;
  }
  else {
    iVar14 = 5;
    if (((pWal->hdr).mxFrame <= puVar7[0x18]) && (iVar14 = 0, 1 < iVar29)) {
      sqlite3_randomness(4,&local_108);
      do {
        if (pWal->exclusiveMode != '\0') {
LAB_00130de3:
          iVar14 = 0;
          if (iVar29 == 3) {
            walRestartHdr(pWal,(u32)local_108);
            iVar14 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
          }
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
          }
          goto LAB_00130e28;
        }
        iVar14 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
        if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar14 != 5)) {
          if (iVar14 == 0) goto LAB_00130de3;
          goto LAB_00130e28;
        }
        iVar14 = (*xBusy)(local_168);
      } while (iVar14 != 0);
      iVar14 = 5;
      goto LAB_00130e28;
    }
    sqlite3_free(__s);
  }
  if (pnLog != (int *)0x0) {
    *pnLog = (pWal->hdr).mxFrame;
  }
  if (pnCkpt != (int *)0x0) {
    *pnCkpt = (*pWal->apWiData)[0x18];
  }
LAB_00130e65:
  if (local_17c != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->ckptLock != '\0') {
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
    }
    pWal->ckptLock = '\0';
  }
  iVar20 = 5;
  if (iVar14 != 0) {
    iVar20 = iVar14;
  }
  if (iVar29 == eMode) {
    iVar20 = iVar14;
  }
  return iVar20;
  while( true ) {
    if (((uVar26 < uVar25) && (uVar25 <= uVar19)) && (uVar27 <= (uint)local_128)) {
      iVar14 = (*pWal->pWalFd->pMethods->xRead)
                         (pWal->pWalFd,zBuf,uVar16,(uVar25 - 1) * local_178 + 0x38);
      if (iVar14 != 0) goto LAB_0013172b;
      iVar14 = (*pWal->pDbFd->pMethods->xWrite)(pWal->pDbFd,zBuf,uVar16,(uVar27 - 1) * uVar30);
      uVar26 = (uint)local_170;
      if (iVar14 != 0) goto LAB_0013172b;
    }
    uVar24 = __s[1];
    if ((int)uVar24 < 1) break;
LAB_001315e8:
    uVar4 = *__s;
    uVar27 = 0xffffffff;
    uVar22 = (ulong)uVar24;
    do {
      uVar17 = uVar22 - 1;
      uVar24 = __s[uVar17 * 8 + 2];
      if ((int)uVar24 < (int)__s[uVar17 * 8 + 8]) {
        puVar31 = __s + uVar17 * 8 + 2;
        puVar23 = (ushort *)((long)(int)uVar24 * 2 + *(long *)(puVar31 + 2));
        do {
          uVar24 = uVar24 + 1;
          uVar5 = *(uint *)(*(long *)(puVar31 + 4) + (ulong)*puVar23 * 4);
          if (uVar4 < uVar5) {
            if (uVar5 < uVar27) {
              uVar25 = (uint)*puVar23 + puVar31[7];
              uVar27 = uVar5;
            }
            break;
          }
          *puVar31 = uVar24;
          puVar23 = puVar23 + 1;
        } while (uVar24 != __s[uVar17 * 8 + 8]);
      }
      bVar8 = 1 < (long)uVar22;
      uVar22 = uVar17;
    } while (bVar8);
    *__s = uVar27;
    if (uVar27 == 0xffffffff) goto LAB_00131717;
    if ((psVar13->u1).isInterrupted != 0) {
      iVar14 = (uint)(psVar13->mallocFailed == '\0') * 2 + 7;
      goto LAB_0013172b;
    }
  }
LAB_00131711:
  *__s = 0xffffffff;
LAB_00131717:
  iVar14 = 0;
LAB_0013172b:
  local_198 = (ulong)uVar16;
  psVar6 = pWal->pDbFd->pMethods;
  if (psVar6 != (sqlite3_io_methods *)0x0) {
    (*psVar6->xFileControl)(pWal->pDbFd,0x25,(void *)0x0);
  }
  if ((iVar14 == 0) &&
     ((uVar19 != (*pWal->apWiData)[4] ||
      ((iVar14 = (*pWal->pDbFd->pMethods->xTruncate)(pWal->pDbFd,local_198 * (pWal->hdr).nPage),
       iVar14 == 0 &&
       ((uVar21 == 0 || (iVar14 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar21), iVar14 == 0))
       )))))) {
    puVar7[0x18] = uVar19;
    iVar14 = 0;
  }
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
  }
LAB_00130c9f:
  iVar20 = 0;
  if (iVar14 != 5) {
    iVar20 = iVar14;
  }
  goto LAB_00130ca7;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. If blocking locks are successfully
  ** enabled, set xBusy2=0 so that the busy-handler is never invoked. */
  sqlite3WalDb(pWal, db);
  (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    walDisableBlocking(pWal);
    rc = walIndexReadHdr(pWal, &isChanged);
    (void)walEnableBlocking(pWal);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}